

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O0

int lws_hdr_extant(lws *wsi,lws_token_indexes h)

{
  allocated_headers *paVar1;
  int n;
  allocated_headers *ah;
  lws_token_indexes h_local;
  lws *wsi_local;
  
  paVar1 = (wsi->http).ah;
  if (paVar1 == (allocated_headers *)0x0) {
    wsi_local._4_4_ = 0;
  }
  else if (paVar1->frag_index[h] == 0) {
    wsi_local._4_4_ = 0;
  }
  else {
    wsi_local._4_4_ = (uint)((paVar1->frags[(int)(uint)paVar1->frag_index[h]].flags & 2) != 0);
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_hdr_extant(struct lws *wsi, enum lws_token_indexes h)
{
	struct allocated_headers *ah = wsi->http.ah;
	int n;

	if (!ah)
		return 0;

	n = ah->frag_index[h];
	if (!n)
		return 0;

	return !!(ah->frags[n].flags & 2);
}